

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

bool process_args(int argc,char **argv,conf_t *config)

{
  pointer *pppcVar1;
  char *pcVar2;
  iterator __position;
  char *pcVar3;
  int iVar4;
  
  if (1 < argc) {
    iVar4 = 1;
    do {
      pcVar2 = argv[iVar4];
      if (*pcVar2 == '-') {
        if ((pcVar2[1] == 'h') && (pcVar2[2] == '\0')) {
          return false;
        }
        if ((pcVar2[1] == 'v') && (pcVar2[2] == '\0')) {
          config->verbose = true;
        }
        else if ((pcVar2[1] == 's') && (pcVar2[2] == '\0')) {
          config->simulate = true;
        }
        else {
          if ((pcVar2[1] != 'o') || (pcVar2[2] != '\0')) goto LAB_00102b8f;
          if (argc + -1 <= iVar4) {
            return false;
          }
          pcVar2 = argv[(long)iVar4 + 1];
          pcVar3 = (char *)(config->output_path)._M_string_length;
          strlen(pcVar2);
          std::__cxx11::string::_M_replace((ulong)&config->output_path,0,pcVar3,(ulong)pcVar2);
          iVar4 = iVar4 + 1;
        }
      }
      else {
LAB_00102b8f:
        __position._M_current =
             (config->files).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (config->files).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<char*,std::allocator<char*>>::_M_realloc_insert<char*const&>
                    ((vector<char*,std::allocator<char*>> *)&config->files,__position,argv + iVar4);
        }
        else {
          *__position._M_current = pcVar2;
          pppcVar1 = &(config->files).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppcVar1 = *pppcVar1 + 1;
        }
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 < argc);
  }
  return (config->files).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
         super__Vector_impl_data._M_finish !=
         (config->files).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
         super__Vector_impl_data._M_start;
}

Assistant:

bool process_args(int argc, char **argv, conf_t &config)
{
	for (int i = 1; i < argc; ++i) {
		if (!strcmp(argv[i], "-h")) {
			return false;
		} else if (!strcmp(argv[i], "-v")) {
			config.verbose = true;
		} else if (!strcmp(argv[i], "-s")) {
			config.simulate = true;
		} else if (!strcmp(argv[i], "-o")) {
			if (i < argc - 1) {
				config.output_path = argv[++i];
			} else {
				return false;
			}
		} else {
			config.files.push_back(argv[i]);
		}
	}

	if (config.files.size() > 0) {
		return true;
	} else {
		return false;
	}
}